

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

btScalar gjkepa2_impl::GJK::projectorigin(btVector3 *a,btVector3 *b,btVector3 *c,btScalar *w,U *m)

{
  uint uVar1;
  btVector3 *pbVar2;
  long lVar3;
  byte bVar4;
  float fVar5;
  btScalar bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  btScalar subw [2];
  U subm;
  btVector3 dl [3];
  btVector3 *vt [3];
  btScalar local_a8 [2];
  float local_a0;
  float local_9c;
  float local_98;
  U local_94;
  btVector3 *local_90;
  undefined1 local_88 [4];
  float afStack_84 [3];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  btVector3 *local_58;
  btVector3 *local_50;
  btVector3 *local_48 [3];
  
  local_48[0] = a;
  local_48[1] = b;
  local_48[2] = c;
  local_9c = (float)*(undefined8 *)b->m_floats;
  local_a0 = (float)((ulong)*(undefined8 *)b->m_floats >> 0x20);
  fVar5 = (float)*(undefined8 *)a->m_floats;
  fVar11 = (float)((ulong)*(undefined8 *)a->m_floats >> 0x20);
  fVar7 = fVar5 - local_9c;
  fVar9 = fVar11 - local_a0;
  fVar10 = a->m_floats[2] - b->m_floats[2];
  unique0x10000064 = fVar9;
  local_88 = fVar7;
  unique0x10000068 = fVar10;
  unique0x1000006c = 0;
  fVar12 = (float)*(undefined8 *)c->m_floats;
  fVar8 = (float)((ulong)*(undefined8 *)c->m_floats >> 0x20);
  local_9c = local_9c - fVar12;
  local_a0 = local_a0 - fVar8;
  local_98 = b->m_floats[2] - c->m_floats[2];
  local_78._4_4_ = local_a0;
  local_78._0_4_ = local_9c;
  local_78._8_4_ = local_98;
  local_78._12_4_ = 0;
  local_68._4_4_ = fVar8 - fVar11;
  local_68._0_4_ = fVar12 - fVar5;
  fStack_60 = c->m_floats[2] - a->m_floats[2];
  unique0x10000090 = 0;
  fVar11 = fVar9 * local_98 - local_a0 * fVar10;
  fVar12 = fVar10 * local_9c - local_98 * fVar7;
  fVar7 = fVar7 * local_a0 - local_9c * fVar9;
  fVar5 = fVar7 * fVar7 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar5 <= 0.0) {
    fVar9 = -1.0;
  }
  else {
    local_58 = a;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_94 = 0;
    fVar9 = -1.0;
    lVar3 = 0;
    bVar4 = 0;
    local_90 = c;
    local_50 = b;
    do {
      pbVar2 = *(btVector3 **)((long)local_48 + lVar3 * 2);
      if (0.0 < (*(float *)(local_88 + lVar3 * 4) * fVar12 -
                fVar11 * *(float *)(local_88 + lVar3 * 4 + 4)) * pbVar2->m_floats[2] +
                (*(float *)(local_88 + lVar3 * 4 + 4) * fVar7 -
                fVar12 * *(float *)(local_88 + lVar3 * 4 + 8)) * pbVar2->m_floats[0] +
                (*(float *)(local_88 + lVar3 * 4 + 8) * fVar11 -
                fVar7 * *(float *)(local_88 + lVar3 * 4)) * pbVar2->m_floats[1]) {
        uVar1 = *(uint *)((long)projectorigin::imd3 + lVar3);
        bVar6 = projectorigin(pbVar2,local_48[uVar1],local_a8,&local_94);
        if ((fVar9 < 0.0) || (bVar6 < fVar9)) {
          *m = (1 << ((byte)uVar1 & 0x1f) & (int)(local_94 << 0x1e) >> 0x1f) +
               (1 << (bVar4 & 0x1f) & -(local_94 & 1));
          *(btScalar *)((long)w + lVar3) = local_a8[0];
          w[uVar1] = local_a8[1];
          w[projectorigin::imd3[uVar1]] = 0.0;
          fVar9 = bVar6;
        }
      }
      bVar4 = bVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0xc);
    if (fVar9 < 0.0) {
      fVar9 = local_58->m_floats[1];
      fVar8 = local_58->m_floats[0];
      fVar10 = local_58->m_floats[2];
      if (fVar5 < 0.0) {
        fVar13 = sqrtf(fVar5);
      }
      else {
        fVar13 = SQRT(fVar5);
      }
      pbVar2 = local_90;
      fVar5 = (fVar10 * fVar7 + fVar8 * fVar11 + fVar9 * fVar12) / fVar5;
      fVar11 = fVar11 * fVar5;
      fVar12 = fVar12 * fVar5;
      fVar7 = fVar7 * fVar5;
      *m = 7;
      fVar9 = local_50->m_floats[0] - fVar11;
      fVar5 = local_50->m_floats[1] - fVar12;
      fVar8 = local_50->m_floats[2] - fVar7;
      fVar10 = local_a0 * fVar8 - fVar5 * local_98;
      fVar8 = local_98 * fVar9 - fVar8 * local_9c;
      fVar5 = fVar5 * local_9c - fVar9 * local_a0;
      fVar5 = fVar5 * fVar5 + fVar10 * fVar10 + fVar8 * fVar8;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      *w = fVar5 / fVar13;
      fVar9 = pbVar2->m_floats[0] - fVar11;
      fVar5 = pbVar2->m_floats[1] - fVar12;
      fVar8 = pbVar2->m_floats[2] - fVar7;
      fVar10 = (float)local_68._4_4_ * fVar8 - fVar5 * fStack_60;
      fVar8 = fStack_60 * fVar9 - fVar8 * (float)local_68._0_4_;
      fVar5 = fVar5 * (float)local_68._0_4_ - fVar9 * (float)local_68._4_4_;
      fVar5 = fVar5 * fVar5 + fVar10 * fVar10 + fVar8 * fVar8;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      fVar9 = fVar7 * fVar7 + fVar11 * fVar11 + fVar12 * fVar12;
      w[1] = fVar5 / fVar13;
      w[2] = 1.0 - (fVar5 / fVar13 + *w);
    }
  }
  return fVar9;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c};
				const btVector3		dl[]={a-b,b-c,c-a};
				const btVector3		n=btCross(dl[0],dl[1]);
				const btScalar		l=n.length2();
				if(l>GJK_SIMPLEX3_EPS)
				{
					btScalar	mindist=-1;
					btScalar	subw[2]={0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						if(btDot(*vt[i],btCross(dl[i],n))>0)
						{
							const U			j=imd3[i];
							const btScalar	subd(projectorigin(*vt[i],*vt[j],subw,subm));
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>(((subm&1)?1<<i:0)+((subm&2)?1<<j:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;				
							}
						}
					}
					if(mindist<0)
					{
						const btScalar	d=btDot(a,n);	
						const btScalar	s=btSqrt(l);
						const btVector3	p=n*(d/l);
						mindist	=	p.length2();
						m		=	7;
						w[0]	=	(btCross(dl[1],b-p)).length()/s;
						w[1]	=	(btCross(dl[2],c-p)).length()/s;
						w[2]	=	1-(w[0]+w[1]);
					}
					return(mindist);
				}
				return(-1);
			}